

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
* __thiscall
wasm::StackIROptimizer::findStringViewDeferredGets
          (unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
           *__return_storage_ptr__,StackIROptimizer *this)

{
  pointer ppSVar1;
  Expression *pEVar2;
  pointer ppSVar3;
  anon_class_8_1_0e8a2d5d local_38;
  anon_class_8_1_0e8a2d5d note;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  ppSVar1 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38.deferred = __return_storage_ptr__;
  for (ppSVar3 = (this->insts->
                 super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1) {
    if (*ppSVar3 != (StackInst *)0x0) {
      pEVar2 = (*ppSVar3)->origin;
      if (pEVar2->_id == StringSliceWTFId) {
        findStringViewDeferredGets::anon_class_8_1_0e8a2d5d::operator()
                  (&local_38,(Expression *)pEVar2[1].type.id);
        findStringViewDeferredGets::anon_class_8_1_0e8a2d5d::operator()
                  (&local_38,*(Expression **)(pEVar2 + 2));
      }
      else if (pEVar2->_id == StringWTF16GetId) {
        findStringViewDeferredGets::anon_class_8_1_0e8a2d5d::operator()
                  (&local_38,(Expression *)pEVar2[1].type.id);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<LocalGet*> StackIROptimizer::findStringViewDeferredGets() {
  std::unordered_set<LocalGet*> deferred;
  auto note = [&](Expression* e) {
    if (auto* get = e->dynCast<LocalGet>()) {
      deferred.insert(get);
    }
  };
  for (auto* inst : insts) {
    if (!inst) {
      continue;
    }
    if (auto* curr = inst->origin->dynCast<StringWTF16Get>()) {
      note(curr->pos);
    } else if (auto* curr = inst->origin->dynCast<StringSliceWTF>()) {
      note(curr->start);
      note(curr->end);
    }
  }
  return deferred;
}